

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_test.cpp
# Opt level: O0

int PMPML_TestSpeedAlt_64_out_32(void *key,int len,int iter)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int in_EDX;
  uint in_ESI;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  uint *in_RDI;
  bool bVar12;
  int i;
  int dummy;
  uint32_t part;
  uint32_t hi;
  uint32_t lo;
  uint32_t *x;
  uint32_t xLast;
  uint32_t size;
  uint64_t ctr;
  ULARGE_INTEGER__XX constTerm;
  uint32_t *coeff;
  uint64_t dummy2_27;
  uint64_t dummy1_27;
  uint64_t dummy2_26;
  uint64_t dummy1_26;
  uint64_t dummy2_25;
  uint64_t dummy1_25;
  uint64_t dummy2_24;
  uint64_t dummy1_24;
  uint64_t dummy2_23;
  uint64_t dummy1_23;
  uint64_t dummy2_22;
  uint64_t dummy1_22;
  uint64_t dummy2_21;
  uint64_t dummy1_21;
  uint64_t dummy2;
  uint64_t dummy1;
  uint64_t dummy2_2;
  uint64_t dummy1_2;
  uint64_t dummy2_1;
  uint64_t dummy1_1;
  uint64_t dummy2_5;
  uint64_t dummy1_5;
  uint64_t dummy2_4;
  uint64_t dummy1_4;
  uint64_t dummy2_3;
  uint64_t dummy1_3;
  uint64_t dummy2_9;
  uint64_t dummy1_9;
  uint64_t dummy2_8;
  uint64_t dummy1_8;
  uint64_t dummy2_7;
  uint64_t dummy1_7;
  uint64_t dummy2_6;
  uint64_t dummy1_6;
  uint64_t dummy2_14;
  uint64_t dummy1_14;
  uint64_t dummy2_13;
  uint64_t dummy1_13;
  uint64_t dummy2_12;
  uint64_t dummy1_12;
  uint64_t dummy2_11;
  uint64_t dummy1_11;
  uint64_t dummy2_10;
  uint64_t dummy1_10;
  uint64_t dummy2_28;
  uint64_t dummy1_28;
  uint64_t dummy2_20;
  uint64_t dummy1_20;
  uint64_t dummy2_19;
  uint64_t dummy1_19;
  uint64_t dummy2_18;
  uint64_t dummy1_18;
  uint64_t dummy2_17;
  uint64_t dummy1_17;
  uint64_t dummy2_16;
  uint64_t dummy1_16;
  uint64_t dummy2_15;
  uint64_t dummy1_15;
  uint in_stack_00001cdc;
  uchar *in_stack_00001ce0;
  PMP_Multilinear_Hasher_64_out_32 *in_stack_00001ce8;
  int local_510;
  int local_50c;
  uint *in_stack_fffffffffffffb18;
  uint in_stack_fffffffffffffb20;
  uint in_stack_fffffffffffffb24;
  PMP_Multilinear_Hasher_64_out_32 *in_stack_fffffffffffffb28;
  ulong uVar13;
  PMP_Multilinear_Hasher_64_out_32 local_4d0;
  PMP_Multilinear_Hasher_64_out_32 *local_4b0;
  uint local_4a4;
  undefined8 local_4a0;
  ulong local_498;
  uint local_490;
  uint local_48c;
  undefined1 *local_488;
  PMP_Multilinear_Hasher_64_out_32 *local_480;
  undefined8 local_478;
  ulong local_470;
  uint local_468;
  uint local_464;
  undefined1 *local_460;
  PMP_Multilinear_Hasher_64_out_32 *local_458;
  undefined8 local_450;
  ulong local_448;
  uint local_440;
  uint in_stack_fffffffffffffbc4;
  uchar *in_stack_fffffffffffffbc8;
  PMP_Multilinear_Hasher_64_out_32 *in_stack_fffffffffffffbd0;
  
  local_50c = 0;
  for (local_510 = 0; local_510 < in_EDX; local_510 = local_510 + 1) {
    local_4b0 = &pmpml_hasher_64_out_32;
    if (in_ESI < 0x20) {
      local_4d0.curr_rd = (random_data_for_MPSHF *)(pmpml_hasher_64_out_32.curr_rd)->random_coeff;
      local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 =
           (_func_int **)(pmpml_hasher_64_out_32.curr_rd)->const_term;
      uVar13 = 0;
      in_stack_fffffffffffffb24 = in_ESI >> 2;
      switch(in_stack_fffffffffffffb24) {
      case 0:
        break;
      case 1:
        bVar12 = CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                        (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 =
             (_func_int **)
             ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
             (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        uVar13 = (ulong)bVar12;
        break;
      case 2:
        bVar12 = CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                        (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        pp_Var6 = (_func_int **)
                  ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
                  (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        uVar13 = (ulong)in_RDI[1] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = (_func_int **)((long)pp_Var6 + uVar13);
        uVar13 = (ulong)bVar12 + (ulong)CARRY8((ulong)pp_Var6,uVar13);
        break;
      case 3:
        bVar12 = CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                        (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        pp_Var6 = (_func_int **)
                  ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
                  (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        uVar13 = (ulong)in_RDI[1] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        pp_Var7 = (_func_int **)((long)pp_Var6 + uVar13);
        uVar4 = (ulong)in_RDI[2] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = (_func_int **)((long)pp_Var7 + uVar4);
        uVar13 = (ulong)bVar12 + (ulong)CARRY8((ulong)pp_Var6,uVar13) +
                 (ulong)CARRY8((ulong)pp_Var7,uVar4);
        break;
      case 4:
        bVar12 = CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                        (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        pp_Var6 = (_func_int **)
                  ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
                  (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        uVar13 = (ulong)in_RDI[1] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        pp_Var7 = (_func_int **)((long)pp_Var6 + uVar13);
        uVar4 = (ulong)in_RDI[2] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        pp_Var8 = (_func_int **)((long)pp_Var7 + uVar4);
        uVar5 = (ulong)in_RDI[3] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = (_func_int **)((long)pp_Var8 + uVar5);
        uVar13 = (ulong)bVar12 + (ulong)CARRY8((ulong)pp_Var6,uVar13) +
                 (ulong)CARRY8((ulong)pp_Var7,uVar4) + (ulong)CARRY8((ulong)pp_Var8,uVar5);
        break;
      case 5:
        bVar12 = CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                        (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        pp_Var6 = (_func_int **)
                  ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
                  (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        uVar13 = (ulong)in_RDI[1] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        pp_Var7 = (_func_int **)((long)pp_Var6 + uVar13);
        uVar4 = (ulong)in_RDI[2] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        pp_Var8 = (_func_int **)((long)pp_Var7 + uVar4);
        uVar5 = (ulong)in_RDI[3] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        pp_Var9 = (_func_int **)((long)pp_Var8 + uVar5);
        uVar2 = (ulong)in_RDI[4] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = (_func_int **)((long)pp_Var9 + uVar2);
        uVar13 = (ulong)bVar12 + (ulong)CARRY8((ulong)pp_Var6,uVar13) +
                 (ulong)CARRY8((ulong)pp_Var7,uVar4) + (ulong)CARRY8((ulong)pp_Var8,uVar5) +
                 (ulong)CARRY8((ulong)pp_Var9,uVar2);
        break;
      case 6:
        bVar12 = CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                        (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        pp_Var6 = (_func_int **)
                  ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
                  (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        uVar13 = (ulong)in_RDI[1] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        pp_Var7 = (_func_int **)((long)pp_Var6 + uVar13);
        uVar4 = (ulong)in_RDI[2] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        pp_Var8 = (_func_int **)((long)pp_Var7 + uVar4);
        uVar5 = (ulong)in_RDI[3] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        pp_Var9 = (_func_int **)((long)pp_Var8 + uVar5);
        uVar2 = (ulong)in_RDI[4] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        pp_Var10 = (_func_int **)((long)pp_Var9 + uVar2);
        uVar3 = (ulong)in_RDI[5] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = (_func_int **)((long)pp_Var10 + uVar3);
        uVar13 = (ulong)bVar12 + (ulong)CARRY8((ulong)pp_Var6,uVar13) +
                 (ulong)CARRY8((ulong)pp_Var7,uVar4) + (ulong)CARRY8((ulong)pp_Var8,uVar5) +
                 (ulong)CARRY8((ulong)pp_Var9,uVar2) + (ulong)CARRY8((ulong)pp_Var10,uVar3);
        break;
      default:
        bVar12 = CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                        (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        pp_Var6 = (_func_int **)
                  ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
                  (ulong)*in_RDI * (ulong)*(uint *)local_4d0.curr_rd);
        uVar13 = (ulong)in_RDI[1] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        pp_Var7 = (_func_int **)((long)pp_Var6 + uVar13);
        uVar4 = (ulong)in_RDI[2] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        pp_Var8 = (_func_int **)((long)pp_Var7 + uVar4);
        uVar5 = (ulong)in_RDI[3] * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        pp_Var9 = (_func_int **)((long)pp_Var8 + uVar5);
        in_stack_fffffffffffffbc4 = in_RDI[4];
        local_440 = (pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        in_stack_fffffffffffffbd0 = &local_4d0;
        in_stack_fffffffffffffbc8 = &stack0xfffffffffffffb28;
        local_448 = (ulong)in_stack_fffffffffffffbc4 * (ulong)local_440;
        local_450 = SUB168(SEXT816((long)(ulong)in_stack_fffffffffffffbc4) *
                           SEXT816((long)(ulong)local_440),8);
        pp_Var10 = (_func_int **)((long)pp_Var9 + local_448);
        local_464 = in_RDI[5];
        local_468 = (pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
        local_458 = &local_4d0;
        local_460 = &stack0xfffffffffffffb28;
        local_470 = (ulong)local_464 * (ulong)local_468;
        local_478 = SUB168(SEXT816((long)(ulong)local_464) * SEXT816((long)(ulong)local_468),8);
        pp_Var11 = (_func_int **)((long)pp_Var10 + local_470);
        local_48c = in_RDI[6];
        local_490 = (pmpml_hasher_64_out_32.curr_rd)->random_coeff[6];
        local_480 = &local_4d0;
        local_488 = &stack0xfffffffffffffb28;
        local_498 = (ulong)local_48c * (ulong)local_490;
        local_4a0 = SUB168(SEXT816((long)(ulong)local_48c) * SEXT816((long)(ulong)local_490),8);
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 =
             (_func_int **)((long)pp_Var11 + local_498);
        uVar13 = (ulong)bVar12 + (ulong)CARRY8((ulong)pp_Var6,uVar13) +
                 (ulong)CARRY8((ulong)pp_Var7,uVar4) + (ulong)CARRY8((ulong)pp_Var8,uVar5) +
                 (ulong)CARRY8((ulong)pp_Var9,local_448) + (ulong)CARRY8((ulong)pp_Var10,local_470)
                 + (ulong)CARRY8((ulong)pp_Var11,local_498);
      }
      uVar1 = in_ESI & 3;
      if (uVar1 == 0) {
        in_stack_fffffffffffffb20 = 1;
      }
      else if (uVar1 == 1) {
        in_stack_fffffffffffffb20 = *(byte *)((long)in_RDI + (ulong)(in_ESI - 1)) + 0x100;
      }
      else if (uVar1 == 2) {
        in_stack_fffffffffffffb20 = *(ushort *)((long)in_RDI + ((ulong)in_ESI - 2)) + 0x10000;
      }
      else {
        in_stack_fffffffffffffb20 =
             (uint)*(byte *)((long)in_RDI + (ulong)(in_ESI - 1)) * 0x10000 +
             (uint)*(ushort *)((long)in_RDI + ((ulong)in_ESI - 3)) + 0x1000000;
      }
      pp_Var6 = (_func_int **)
                ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
                (ulong)in_stack_fffffffffffffb20 *
                (ulong)*(uint32_t *)((long)local_4d0.curr_rd + (ulong)in_stack_fffffffffffffb24 * 4)
                );
      in_stack_fffffffffffffb28 =
           (PMP_Multilinear_Hasher_64_out_32 *)
           (uVar13 + CARRY8((ulong)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32,
                            (ulong)in_stack_fffffffffffffb20 *
                            (ulong)*(uint32_t *)
                                    ((long)local_4d0.curr_rd + (ulong)in_stack_fffffffffffffb24 * 4)
                           ));
      uVar13 = ((ulong)pp_Var6 >> 0x20) * 0xf;
      uVar1 = (int)in_stack_fffffffffffffb28 * 0xe1 + (int)(uVar13 >> 0x20) * 0xf + 0xf;
      local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._0_4_ = (uint)pp_Var6;
      local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._0_4_ =
           uVar1 + (uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32;
      local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 =
           (_func_int **)
           CONCAT44(((uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 < uVar1) + 1,
                    (uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32);
      pp_Var6 = (_func_int **)
                ((long)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 - (uVar13 & 0xffffffff));
      local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._0_4_ = (uint)pp_Var6;
      local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._4_4_ = (int)((ulong)pp_Var6 >> 0x20);
      in_stack_fffffffffffffb18 = in_RDI;
      if ((uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 < 0x1e) {
        if (local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._4_4_ == 0) {
          uVar1 = (uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32;
          local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = pp_Var6;
          uVar1 = fmix32_short(uVar1);
        }
        else {
          uVar1 = (uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 -
                  (local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._4_4_ * 0xf + -0xf);
          local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = (_func_int **)CONCAT44(1,uVar1);
          if (0xe < uVar1) {
            local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 = (_func_int **)CONCAT44(1,uVar1 - 0xf)
            ;
            uVar1 = fmix32_short(uVar1 - 0xf);
          }
        }
      }
      else {
        local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._0_4_ =
             (uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32 +
             local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32._4_4_ * -0xf;
        uVar1 = fmix32_short((uint)local_4d0._vptr_PMP_Multilinear_Hasher_64_out_32);
      }
    }
    else if (in_ESI < 0x200) {
      uVar1 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThanChunk
                        (in_stack_fffffffffffffb28,
                         (uchar *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                         (uint)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    }
    else if (in_ESI < 0x1000) {
      uVar1 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
                        (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                         in_stack_fffffffffffffbc4);
    }
    else {
      uVar1 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_type2
                        (in_stack_00001ce8,in_stack_00001ce0,in_stack_00001cdc);
    }
    local_4a4 = uVar1;
    local_50c = local_4a4 + local_50c;
  }
  return local_50c;
}

Assistant:

int PMPML_TestSpeedAlt_64_out_32( const void * key, int len, int iter )
{
	int dummy = 0;
	for ( int i=0; i<iter; i++ )
	{
		dummy += pmpml_hasher_64_out_32.hash( (unsigned char*)key, len );
	}
	return dummy;
}